

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

void Jf_ManFree(Jf_Man_t *p)

{
  Vec_Mem_t *pVVar1;
  long lVar2;
  Jf_Par_t *pJVar3;
  int *piVar4;
  float *pfVar5;
  word *__ptr;
  word **__ptr_00;
  int iVar6;
  int level;
  long lVar7;
  timespec ts;
  timespec local_28;
  
  if ((p->pPars->fVerbose != 0) && (p->pDsd != (Sdm_Man_t *)0x0)) {
    Sdm_ManPrintDsdStats(p->pDsd,0);
  }
  if ((p->pPars->fVerbose != 0) && (pVVar1 = p->vTtMem, pVVar1 != (Vec_Mem_t *)0x0)) {
    printf("Unique truth tables = %d. Memory = %.2f MB   ",
           ((double)pVVar1->nPageAlloc * 8.0 +
            (double)(pVVar1->iPage + 1) *
            (double)(1 << ((byte)pVVar1->LogPageSze & 0x1f)) * (double)pVVar1->nEntrySize * 8.0 +
           48.0) * 9.5367431640625e-07,(ulong)(uint)pVVar1->nEntries);
    level = 3;
    iVar6 = clock_gettime(3,&local_28);
    if (iVar6 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    lVar2 = p->clkStart;
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar7 - lVar2) / 1000000.0);
  }
  pJVar3 = p->pPars;
  if (((pJVar3->fVeryVerbose != 0) && (pJVar3->fCutMin != 0)) && (pJVar3->fFuncDsd != 0)) {
    Jf_ManProfileClasses(p);
  }
  if (p->pPars->fCoarsen != 0) {
    Gia_ManCleanMark0(p->pGia);
  }
  piVar4 = p->pGia->pRefs;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    p->pGia->pRefs = (int *)0x0;
  }
  piVar4 = (p->vCuts).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (p->vCuts).pArray = (int *)0x0;
  }
  piVar4 = (p->vArr).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (p->vArr).pArray = (int *)0x0;
  }
  piVar4 = (p->vDep).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (p->vDep).pArray = (int *)0x0;
  }
  pfVar5 = (p->vFlow).pArray;
  if (pfVar5 != (float *)0x0) {
    free(pfVar5);
    (p->vFlow).pArray = (float *)0x0;
  }
  pfVar5 = (p->vRefs).pArray;
  if (pfVar5 != (float *)0x0) {
    free(pfVar5);
    (p->vRefs).pArray = (float *)0x0;
  }
  if ((p->pPars->fCutMin != 0) && (p->pPars->fFuncDsd == 0)) {
    pVVar1 = p->vTtMem;
    if (pVVar1 != (Vec_Mem_t *)0x0) {
      if (pVVar1->vTable != (Vec_Int_t *)0x0) {
        piVar4 = pVVar1->vTable->pArray;
        if (piVar4 != (int *)0x0) {
          free(piVar4);
          pVVar1->vTable->pArray = (int *)0x0;
        }
        if (pVVar1->vTable != (Vec_Int_t *)0x0) {
          free(pVVar1->vTable);
          pVVar1->vTable = (Vec_Int_t *)0x0;
        }
      }
      if (pVVar1->vNexts != (Vec_Int_t *)0x0) {
        piVar4 = pVVar1->vNexts->pArray;
        if (piVar4 != (int *)0x0) {
          free(piVar4);
          pVVar1->vNexts->pArray = (int *)0x0;
        }
        if (pVVar1->vNexts != (Vec_Int_t *)0x0) {
          free(pVVar1->vNexts);
          pVVar1->vNexts = (Vec_Int_t *)0x0;
        }
      }
    }
    pVVar1 = p->vTtMem;
    if (-1 < pVVar1->iPage) {
      lVar7 = -1;
      do {
        if (pVVar1->ppPages[lVar7 + 1] != (word *)0x0) {
          free(pVVar1->ppPages[lVar7 + 1]);
          pVVar1->ppPages[lVar7 + 1] = (word *)0x0;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar1->iPage);
    }
    if (pVVar1->ppPages != (word **)0x0) {
      free(pVVar1->ppPages);
      pVVar1->ppPages = (word **)0x0;
    }
    if (pVVar1 != (Vec_Mem_t *)0x0) {
      free(pVVar1);
    }
  }
  if (p->vCnfs != (Vec_Int_t *)0x0) {
    piVar4 = p->vCnfs->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vCnfs->pArray = (int *)0x0;
    }
    if (p->vCnfs != (Vec_Int_t *)0x0) {
      free(p->vCnfs);
      p->vCnfs = (Vec_Int_t *)0x0;
    }
  }
  if (0 < (p->pMem).nPagesAlloc) {
    lVar7 = 0;
    do {
      __ptr = (p->pMem).pPages[lVar7];
      if (__ptr != (word *)0x0) {
        free(__ptr);
        (p->pMem).pPages[lVar7] = (word *)0x0;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->pMem).nPagesAlloc);
  }
  __ptr_00 = (p->pMem).pPages;
  if (__ptr_00 != (word **)0x0) {
    free(__ptr_00);
    (p->pMem).pPages = (word **)0x0;
  }
  if (p->vTemp != (Vec_Int_t *)0x0) {
    piVar4 = p->vTemp->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vTemp->pArray = (int *)0x0;
    }
    if (p->vTemp != (Vec_Int_t *)0x0) {
      free(p->vTemp);
      p->vTemp = (Vec_Int_t *)0x0;
    }
  }
  free(p);
  return;
}

Assistant:

void Jf_ManFree( Jf_Man_t * p )
{
    if ( p->pPars->fVerbose && p->pDsd )
        Sdm_ManPrintDsdStats( p->pDsd, 0 );
    if ( p->pPars->fVerbose && p->vTtMem )
    {
        printf( "Unique truth tables = %d. Memory = %.2f MB   ", Vec_MemEntryNum(p->vTtMem), Vec_MemMemory(p->vTtMem) / (1<<20) ); 
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    }
    if ( p->pPars->fVeryVerbose && p->pPars->fCutMin && p->pPars->fFuncDsd )
        Jf_ManProfileClasses( p );
    if ( p->pPars->fCoarsen )
        Gia_ManCleanMark0( p->pGia );
    ABC_FREE( p->pGia->pRefs );
    ABC_FREE( p->vCuts.pArray );
    ABC_FREE( p->vArr.pArray );
    ABC_FREE( p->vDep.pArray );
    ABC_FREE( p->vFlow.pArray );
    ABC_FREE( p->vRefs.pArray );
    if ( p->pPars->fCutMin && !p->pPars->fFuncDsd )
    {
        Vec_MemHashFree( p->vTtMem );
        Vec_MemFree( p->vTtMem );
    }
    Vec_IntFreeP( &p->vCnfs );
    Vec_SetFree_( &p->pMem );
    Vec_IntFreeP( &p->vTemp );
    ABC_FREE( p );
}